

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

SolverOption * __thiscall
mp::SolverOptionManager::FindOption(SolverOptionManager *this,char *name,bool wildcardvalues)

{
  SolverOption *pSVar1;
  bool bVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  undefined7 in_register_00000011;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar5;
  SolverOption *this_00;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long lVar7;
  string name_str;
  DummyOption option;
  allocator<char> local_155;
  undefined4 local_154;
  char *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  SolverOption *local_140 [4];
  string local_120;
  SolverOption local_100;
  
  local_154 = (undefined4)CONCAT71(in_register_00000011,wildcardvalues);
  local_150 = name;
  SolverOption::SolverOption(&local_100,name,"",(ValueArrayRef)ZEXT816(0),false);
  local_100._vptr_SolverOption = (_func_int **)&PTR__SolverOption_004cc708;
  local_140[0] = &local_100;
  cVar3 = std::
          _Rb_tree<mp::SolverOption_*,_mp::SolverOption_*,_std::_Identity<mp::SolverOption_*>,_mp::SolverOptionManager::OptionNameLess,_std::allocator<mp::SolverOption_*>_>
          ::find(&(this->options_)._M_t,local_140);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->options_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_140,local_150,(allocator<char> *)&local_120);
    for (p_Var4 = (this->options_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var4 != cVar3._M_node; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      this_00 = *(SolverOption **)(p_Var4 + 1);
      __it._M_current =
           (this_00->inline_synonyms_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_148 = (this_00->inline_synonyms_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_120._M_dataplus._M_p = (pointer)local_140;
      lVar5 = (long)local_148 - (long)__it._M_current;
      for (lVar7 = lVar5 >> 7; _Var6._M_current = __it._M_current, 0 < lVar7; lVar7 = lVar7 + -1) {
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                            *)&local_120,__it);
        if (bVar2) goto LAB_00339b12;
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                            *)&local_120,__it._M_current + 1);
        _Var6._M_current = __it._M_current + 1;
        if (bVar2) goto LAB_00339b12;
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                            *)&local_120,__it._M_current + 2);
        _Var6._M_current = __it._M_current + 2;
        if (bVar2) goto LAB_00339b12;
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                            *)&local_120,__it._M_current + 3);
        _Var6._M_current = __it._M_current + 3;
        if (bVar2) goto LAB_00339b12;
        __it._M_current = __it._M_current + 4;
        lVar5 = lVar5 + -0x80;
      }
      lVar5 = lVar5 >> 5;
      if (lVar5 == 1) {
LAB_00339b92:
        bVar2 = __gnu_cxx::__ops::
                _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                            *)&local_120,__it);
        _Var6._M_current = __it._M_current;
        if (!bVar2) {
          _Var6._M_current = local_148;
        }
LAB_00339b12:
        if (_Var6._M_current != local_148) goto LAB_00339bb6;
      }
      else {
        if (lVar5 == 2) {
LAB_00339b76:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                  operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                              *)&local_120,__it);
          _Var6._M_current = __it._M_current;
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00339b92;
          }
          goto LAB_00339b12;
        }
        if (lVar5 == 3) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::$_0>::
                  operator()((_Iter_pred<mp::SolverOptionManager::FindOption(char_const*,bool)const::__0>
                              *)&local_120,__it);
          if (!bVar2) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00339b76;
          }
          goto LAB_00339b12;
        }
      }
      if ((char)local_154 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,local_150,&local_155);
        bVar2 = SolverOption::wc_match(this_00,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        if (bVar2) {
          this_00 = *(SolverOption **)(p_Var4 + 1);
          goto LAB_00339bb6;
        }
      }
    }
    this_00 = (SolverOption *)0x0;
LAB_00339bb6:
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    pSVar1 = *(SolverOption **)(cVar3._M_node + 1);
    this_00 = (SolverOption *)0x0;
    if ((char)local_154 == '\0') {
      this_00 = pSVar1;
    }
    if ((pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pSVar1->wc_headtails_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      this_00 = pSVar1;
    }
  }
  SolverOption::~SolverOption(&local_100);
  return this_00;
}

Assistant:

SolverOption *SolverOptionManager::FindOption(
    const char *name, bool wildcardvalues) const {
  struct DummyOption : SolverOption {
    DummyOption(const char *name) : SolverOption(name, "") {}
    void Write(fmt::Writer &) {}
    void Parse(const char *&, bool) {}
    Option_Type type() {
      return Option_Type::BOOL;
    }
  };
  DummyOption option(name);
  // find by name
  OptionSet::const_iterator i = options_.find(&option);
  if (i != options_.end()) {
    if ((*i)->is_wildcard() && wildcardvalues)
      return 0;
    return *i;
  }

  // find by inline synonyms and wildcards. Case-insensitive
  std::string name_str {name};
  for (OptionSet::const_iterator i = options_.begin();
    i != options_.end(); ++i)
  {
    if (std::find_if((*i)->inline_synonyms().begin(),
                    (*i)->inline_synonyms().end(),
                    [&name_str](const std::string& syn) {
                     return 0==strcasecmp(name_str.c_str(), syn.c_str()); } ) !=
        (*i)->inline_synonyms().end()) {
      return *i;
    }
    /// Wildcards
    if (wildcardvalues && (*i)->wc_match(name))
      return *i;
  }
  return 0;
}